

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usrbdx_binning.cpp
# Opt level: O2

int main(int narg,char **args,char **env)

{
  long lVar1;
  bool bVar2;
  istream *piVar3;
  double *pdVar4;
  void *pvVar5;
  ostream *poVar6;
  long lVar7;
  int i_1;
  int i;
  int iVar8;
  int j;
  int iVar9;
  ulong uVar10;
  int n_a;
  int n_b;
  double local_2b0;
  double b_min;
  double delta_b;
  double delta_a;
  int local_28c;
  double a_max;
  double b_max;
  string nomefile;
  double a_min;
  ifstream infile;
  
  std::ifstream::ifstream(&infile);
  nomefile._M_dataplus._M_p = (pointer)&nomefile.field_2;
  nomefile._M_string_length = 0;
  nomefile.field_2._M_local_buf[0] = '\0';
  if (narg == 3) {
    for (uVar10 = 1; uVar10 < 3; uVar10 = uVar10 + 2) {
      std::__cxx11::string::string((string *)&a_min,args[uVar10],(allocator *)&a_max);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &a_min,"-f");
      std::__cxx11::string::~string((string *)&a_min);
      if (!bVar2) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Invalid argument: ");
        poVar6 = std::operator<<(poVar6,args[uVar10]);
        std::operator<<(poVar6,"\n");
        iVar8 = -2;
        goto LAB_0010276d;
      }
      std::__cxx11::string::assign((char *)&nomefile);
    }
    std::ifstream::open((char *)&infile,(_Ios_Openmode)nomefile._M_dataplus._M_p);
    poVar6 = std::operator<<((ostream *)&std::cerr,"Inizio lettura file ");
    poVar6 = std::operator<<(poVar6,(string *)&nomefile);
    std::endl<char,std::char_traits<char>>(poVar6);
    piVar3 = std::istream::_M_extract<double>((double *)&infile);
    piVar3 = std::istream::_M_extract<double>((double *)piVar3);
    pdVar4 = (double *)std::istream::operator>>(piVar3,&n_a);
    std::istream::_M_extract<double>(pdVar4);
    piVar3 = std::istream::_M_extract<double>((double *)&infile);
    piVar3 = std::istream::_M_extract<double>((double *)piVar3);
    pdVar4 = (double *)std::istream::operator>>(piVar3,&n_b);
    std::istream::_M_extract<double>(pdVar4);
    std::operator<<((ostream *)&std::cerr,"first bin: min = ");
    poVar6 = std::ostream::_M_insert<double>(a_min);
    std::operator<<(poVar6,", max = ");
    poVar6 = std::ostream::_M_insert<double>(a_max);
    poVar6 = std::operator<<(poVar6,", nbin = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,n_a);
    std::operator<<(poVar6,", delta = ");
    poVar6 = std::ostream::_M_insert<double>(delta_a);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::operator<<((ostream *)&std::cerr,"second bin: min = ");
    poVar6 = std::ostream::_M_insert<double>(b_min);
    std::operator<<(poVar6,", max = ");
    poVar6 = std::ostream::_M_insert<double>(b_max);
    poVar6 = std::operator<<(poVar6,", nbin = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,n_b);
    std::operator<<(poVar6,", delta = ");
    poVar6 = std::ostream::_M_insert<double>(delta_b);
    std::endl<char,std::char_traits<char>>(poVar6);
    local_2b0 = a_min;
    lVar7 = ((long)n_b + 1) * ((long)n_a + 1);
    uVar10 = 0xffffffffffffffff;
    if (-1 < (int)lVar7) {
      uVar10 = lVar7 * 8;
    }
    pvVar5 = operator_new__(uVar10);
    poVar6 = std::operator<<((ostream *)&std::cerr,"inizializzato vettore lettura a dimensione ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,n_b + n_a);
    std::endl<char,std::char_traits<char>>(poVar6);
    for (iVar8 = 1; iVar8 <= n_b; iVar8 = iVar8 + 1) {
      for (iVar9 = 1; iVar9 <= n_a; iVar9 = iVar9 + 1) {
        std::istream::_M_extract<double>((double *)&infile);
      }
    }
    iVar9 = 0;
    for (iVar8 = 1; iVar8 <= n_b; iVar8 = iVar8 + 1) {
      local_28c = iVar9;
      for (lVar7 = 1; lVar1 = std::cout, (int)lVar7 <= n_a; lVar7 = lVar7 + 1) {
        *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 7;
        *(uint *)(__gxx_personality_v0 + *(long *)(lVar1 + -0x18)) =
             *(uint *)(__gxx_personality_v0 + *(long *)(lVar1 + -0x18)) | 0x100;
        poVar6 = std::ostream::_M_insert<double>(local_2b0);
        std::operator<<(poVar6,"\t");
        poVar6 = std::ostream::_M_insert<double>(delta_a + local_2b0);
        std::operator<<(poVar6,"\t");
        poVar6 = std::ostream::_M_insert<double>(b_min);
        std::operator<<(poVar6,"\t");
        poVar6 = std::ostream::_M_insert<double>(b_min + delta_b);
        std::operator<<(poVar6,"\t");
        poVar6 = std::ostream::_M_insert<double>
                           (*(double *)((long)pvVar5 + ((long)n_a * (long)iVar9 + lVar7) * 8));
        std::endl<char,std::char_traits<char>>(poVar6);
        local_2b0 = local_2b0 + delta_a;
      }
      local_2b0 = a_min;
      b_min = delta_b + b_min;
      iVar9 = local_28c + 1;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"Fine lettura file ");
    poVar6 = std::operator<<(poVar6,(string *)&nomefile);
    poVar6 = std::operator<<(poVar6,". Riscritti ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,n_b * n_a);
    poVar6 = std::operator<<(poVar6," valori");
    std::endl<char,std::char_traits<char>>(poVar6);
    std::ifstream::close();
    iVar8 = 0;
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"si usa:  ./reader -f file_ascii_usrbdx.txt");
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,"si puo\' redirigere l\'output con > out.txt");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar8 = -1;
  }
LAB_0010276d:
  std::__cxx11::string::~string((string *)&nomefile);
  std::ifstream::~ifstream(&infile);
  return iVar8;
}

Assistant:

int main (int narg, char *args[], char *env[])
{
	ifstream infile;
	string nomefile;

	if(narg != 3)
	{
		cout << "si usa:  ./reader -f file_ascii_usrbdx.txt" << endl;
		cout << "si puo' redirigere l'output con > out.txt" << endl;
		return -1;
	}

	for (int i = 1; i < narg; i++)	// * We will iterate over args[] to get the parameters stored inside.
	{								// * Note that we're starting on 1 because we don't need to know the
									// * path of the program, which is stored in args[0]
		if (string(args[i]) == "-f")
		{
			nomefile = args[i+1];	// We know the next argument *should* be the <nome-file-da-analizzare>:
			i++;					// so that we skip in the for cycle the parsing of the <nome-file-particelle>
		}
		else
		{
			cerr << "Invalid argument: " << args[i] << "\n";
			return -2;
		}
	}

	double a_min, a_max, delta_a, a_temp, b_min, b_max, delta_b;
	int n_a, n_b;
	double * values;

	infile.open(nomefile.c_str());
	cerr << "Inizio lettura file " << nomefile << endl;

	infile >> a_min >> a_max >> n_a >> delta_a;
	infile >> b_min >> b_max >> n_b >> delta_b;

	cerr << "first bin: min = " << a_min << ", max = " << a_max << ", nbin = " << n_a << ", delta = " << delta_a << endl;
	cerr << "second bin: min = " << b_min << ", max = " << b_max << ", nbin = " << n_b << ", delta = " << delta_b << endl;

	a_temp = a_min;

	values = new double[(n_a+1)*(n_b+1)];

	cerr << "inizializzato vettore lettura a dimensione " << n_a+n_b << endl;
	for (int i = 1; i <= n_b; i++)
	{
		for (int j = 1; j <= n_a; j++)
		{
			infile >> values[(i-1)*n_a + j];
		}
	}

	//	for (int i = 1; i <= n_a*n_b; i++) cerr << values[i] << ' ';

	for (int i = 1; i <= n_b; i++)
	{
		for (int j = 1; j <= n_a; j++)
		{
			cout << setprecision(7) << setiosflags(ios::scientific) << a_temp << "\t" 
				<< a_temp+delta_a << "\t" << b_min << "\t" << b_min+delta_b << "\t" << values[(i-1)*n_a + j] << endl;
			a_temp += delta_a;
		}
		a_temp = a_min;
		b_min += delta_b;
	}

	cerr << "Fine lettura file " << nomefile << ". Riscritti " << n_a*n_b << " valori" << endl;
	infile.close();
	return 0;
}